

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void sptk::world::LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint x_length;
  double *pdVar6;
  double *y;
  double *xi;
  ulong uVar7;
  double *pdVar8;
  double *yi;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint xi_length;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  dVar17 = (double)fft_size;
  dVar2 = (double)fs;
  iVar15 = (int)((dVar17 * width) / dVar2);
  uVar5 = iVar15 + 1;
  uVar7 = (ulong)uVar5;
  iVar16 = fft_size / 2;
  iVar9 = iVar16 + iVar15 * 2 + 2;
  x_length = iVar16 + iVar15 * 2 + 3;
  uVar14 = (long)(int)x_length << 3;
  if (iVar9 < -1) {
    uVar14 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar14);
  y = (double *)operator_new__(uVar14);
  uVar14 = (long)iVar16 * 8 + 8;
  if (fft_size < -3) {
    uVar14 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar14);
  pdVar8 = pdVar6;
  if (-1 < iVar15) {
    do {
      *pdVar8 = input[uVar7];
      uVar7 = uVar7 - 1;
      pdVar8 = pdVar8 + 1;
    } while (uVar7 != 0);
  }
  iVar12 = uVar5 + iVar16;
  if (1 < fft_size) {
    uVar7 = (ulong)iVar15;
    lVar10 = (long)iVar12;
    if ((long)iVar12 < (long)(uVar7 + 2)) {
      lVar10 = uVar7 + 2;
    }
    memcpy(pdVar6 + uVar7 + 1,input,(~uVar7 + lVar10) * 8);
  }
  if (iVar15 < iVar15 * 2 + 2) {
    iVar13 = iVar12;
    if (iVar12 <= iVar9) {
      iVar13 = iVar9;
    }
    lVar10 = 0;
    iVar11 = iVar16;
    do {
      pdVar6[iVar12 + lVar10] = input[iVar11];
      lVar10 = lVar10 + 1;
      iVar11 = iVar11 + -1;
    } while ((iVar13 - iVar15) - iVar16 != (int)lVar10);
  }
  *y = (*pdVar6 * dVar2) / dVar17;
  if (0 < iVar9) {
    dVar1 = *y;
    uVar7 = 1;
    do {
      dVar1 = dVar1 + (pdVar6[uVar7] * dVar2) / dVar17;
      y[uVar7] = dVar1;
      uVar7 = uVar7 + 1;
    } while (x_length != uVar7);
  }
  auVar4 = _DAT_0012bca0;
  auVar3 = _DAT_0012aa40;
  xi_length = iVar16 + 1;
  if (-2 < fft_size) {
    lVar10 = (ulong)xi_length - 1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar7 = 0;
    auVar18 = auVar18 ^ _DAT_0012aa40;
    auVar19 = _DAT_0012aa30;
    do {
      auVar20 = auVar19 ^ auVar3;
      auVar21._0_8_ = uVar7 & 0xffffffff;
      auVar21._8_4_ = (int)uVar7 + 1;
      auVar21._12_4_ = 0;
      auVar22._0_8_ = SUB168(auVar21 | auVar4,0) - auVar4._0_8_;
      auVar22._8_8_ = SUB168(auVar21 | auVar4,8) - auVar4._8_8_;
      auVar23._8_8_ = dVar17;
      auVar23._0_8_ = dVar17;
      auVar23 = divpd(auVar22,auVar23);
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        xi[uVar7] = auVar23._0_8_ * dVar2 + width * -0.5;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        xi[uVar7 + 1] = auVar23._8_8_ * dVar2 + width * -0.5;
      }
      uVar7 = uVar7 + 2;
      lVar10 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar10 + 2;
    } while (((ulong)xi_length + 1 & 0xfffffffffffffffe) != uVar7);
  }
  pdVar8 = (double *)operator_new__(uVar14);
  yi = (double *)operator_new__(uVar14);
  dVar1 = ((double)((ulong)((double)(int)uVar5 + -0.5) ^ (ulong)DAT_0012b340) * dVar2) / dVar17;
  interp1Q(dVar1,dVar2 / dVar17,y,x_length,xi,xi_length,pdVar8);
  if (-2 < fft_size) {
    uVar7 = 0;
    do {
      xi[uVar7] = xi[uVar7] + width;
      uVar7 = uVar7 + 1;
    } while (xi_length != uVar7);
  }
  interp1Q(dVar1,dVar2 / dVar17,y,x_length,xi,xi_length,yi);
  if (-2 < fft_size) {
    uVar7 = 0;
    do {
      output[uVar7] = (yi[uVar7] - pdVar8[uVar7]) / width;
      uVar7 = uVar7 + 1;
    } while (xi_length != uVar7);
  }
  operator_delete__(pdVar6);
  operator_delete__(y);
  operator_delete__(xi);
  operator_delete__(pdVar8);
  operator_delete__(yi);
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}